

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O1

ggml_tensor *
ggml_new_tensor_impl
          (ggml_context *ctx,ggml_type type,int n_dims,int64_t *ne,ggml_tensor *view_src,
          size_t view_offs)

{
  ulong uVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  size_t sVar5;
  void *pvVar6;
  ggml_object *pgVar7;
  long lVar8;
  char *pcVar9;
  long lVar10;
  int line;
  
  if (type < GGML_TYPE_COUNT) {
    if (n_dims - 1U < 4) {
      if (view_src == (ggml_tensor *)0x0) {
        view_src = (ggml_tensor *)0x0;
      }
      else if (view_src->view_src != (ggml_tensor *)0x0) {
        view_offs = view_offs + view_src->view_offs;
        view_src = view_src->view_src;
      }
      uVar1 = type_traits[type].blck_size;
      sVar2 = type_traits[type].type_size;
      uVar3 = (*ne * sVar2) / uVar1;
      if (1 < n_dims) {
        uVar4 = 1;
        do {
          uVar3 = uVar3 * ne[uVar4];
          uVar4 = uVar4 + 1;
        } while ((uint)n_dims != uVar4);
      }
      if (((view_src == (ggml_tensor *)0x0) || (uVar3 == 0)) ||
         (sVar5 = ggml_nbytes(view_src), uVar3 + view_offs <= sVar5)) {
        if (view_src == (ggml_tensor *)0x0) {
          pvVar6 = (void *)0x0;
        }
        else {
          pvVar6 = view_src->data;
        }
        lVar8 = (long)pvVar6 + view_offs;
        if (pvVar6 == (void *)0x0) {
          lVar8 = 0;
        }
        if (view_src == (ggml_tensor *)0x0) {
          if (ctx->no_alloc != false) {
            uVar3 = 0;
          }
        }
        else {
          uVar3 = 0;
        }
        pgVar7 = ggml_new_object(ctx,GGML_OBJECT_TYPE_TENSOR,uVar3 + 0x150);
        if (pgVar7 != (ggml_object *)0x0) {
          pvVar6 = ctx->mem_buffer;
          sVar5 = pgVar7->offs;
          lVar10 = (long)pvVar6 + sVar5 + 0x150;
          if (uVar3 != 0) {
            lVar8 = lVar10;
          }
          *(ggml_type *)(lVar10 + -0x150) = type;
          *(undefined8 *)(lVar10 + -0x14c) = 0;
          *(undefined8 *)(lVar10 + -0x144) = 0x100000000;
          *(undefined8 *)(lVar10 + -0x13c) = 0x100000000;
          *(undefined8 *)(lVar10 + -0x134) = 0x100000000;
          *(undefined8 *)(lVar10 + -0x130) = 1;
          *(undefined8 *)(lVar10 + -0x128) = 1;
          memset((void *)((long)pvVar6 + sVar5 + 0x30),0,0xb8);
          *(ggml_tensor **)(lVar10 + -0x68) = view_src;
          *(size_t *)(lVar10 + -0x60) = view_offs;
          *(long *)(lVar10 + -0x58) = lVar8;
          *(undefined8 *)(lVar10 + -0x50) = 0;
          *(undefined8 *)(lVar10 + -0x48) = 0;
          *(undefined8 *)(lVar10 + -0x40) = 0;
          *(undefined8 *)(lVar10 + -0x38) = 0;
          *(undefined8 *)(lVar10 + -0x30) = 0;
          *(undefined8 *)(lVar10 + -0x28) = 0;
          *(undefined8 *)(lVar10 + -0x20) = 0;
          *(undefined8 *)(lVar10 + -0x18) = 0;
          *(undefined8 *)(lVar10 + -0x10) = 0;
          *(undefined8 *)(lVar10 + -8) = 0;
          if (0 < n_dims) {
            uVar3 = 0;
            do {
              ((ggml_tensor *)((long)pvVar6 + sVar5))->ne[uVar3] = ne[uVar3];
              uVar3 = uVar3 + 1;
            } while ((uint)n_dims != uVar3);
          }
          *(size_t *)((long)pvVar6 + sVar5 + 0x30) = sVar2;
          lVar8 = (*(long *)((long)pvVar6 + sVar5 + 0x10) / (long)uVar1) * sVar2;
          *(long *)((long)pvVar6 + sVar5 + 0x38) = lVar8;
          lVar10 = 0;
          do {
            lVar8 = lVar8 * *(long *)((long)pvVar6 + lVar10 * 8 + sVar5 + 0x18);
            *(long *)((long)pvVar6 + lVar10 * 8 + sVar5 + 0x40) = lVar8;
            lVar10 = lVar10 + 1;
          } while (lVar10 != 2);
          ctx->n_objects = ctx->n_objects + 1;
          return (ggml_tensor *)((long)pvVar6 + sVar5);
        }
        pcVar9 = "obj_new";
        line = 0x646;
      }
      else {
        pcVar9 = 
        "view_src == NULL || data_size == 0 || data_size + view_offs <= ggml_nbytes(view_src)";
        line = 0x637;
      }
    }
    else {
      pcVar9 = "n_dims >= 1 && n_dims <= GGML_MAX_DIMS";
      line = 0x62a;
    }
  }
  else {
    pcVar9 = "type >= 0 && type < GGML_TYPE_COUNT";
    line = 0x629;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",line,
             "GGML_ASSERT(%s) failed",pcVar9);
}

Assistant:

static struct ggml_tensor * ggml_new_tensor_impl(
        struct ggml_context * ctx,
        enum   ggml_type      type,
        int                   n_dims,
        const int64_t       * ne,
        struct ggml_tensor  * view_src,
        size_t                view_offs) {

    GGML_ASSERT(type >= 0 && type < GGML_TYPE_COUNT);
    GGML_ASSERT(n_dims >= 1 && n_dims <= GGML_MAX_DIMS);

    // find the base tensor and absolute offset
    if (view_src != NULL && view_src->view_src != NULL) {
        view_offs += view_src->view_offs;
        view_src   = view_src->view_src;
    }

    size_t data_size = ggml_row_size(type, ne[0]);
    for (int i = 1; i < n_dims; i++) {
        data_size *= ne[i];
    }

    GGML_ASSERT(view_src == NULL || data_size == 0 || data_size + view_offs <= ggml_nbytes(view_src));

    void * data = view_src != NULL ? view_src->data : NULL;
    if (data != NULL) {
        data = (char *) data + view_offs;
    }

    size_t obj_alloc_size = 0;

    if (view_src == NULL && !ctx->no_alloc) {
        // allocate tensor data in the context's memory pool
        obj_alloc_size = data_size;
    }

    struct ggml_object * const obj_new = ggml_new_object(ctx, GGML_OBJECT_TYPE_TENSOR, GGML_TENSOR_SIZE + obj_alloc_size);
    GGML_ASSERT(obj_new);

    struct ggml_tensor * const result = (struct ggml_tensor *)((char *)ctx->mem_buffer + obj_new->offs);

    *result = (struct ggml_tensor) {
        /*.type         =*/ type,
        /*.buffer       =*/ NULL,
        /*.ne           =*/ { 1, 1, 1, 1 },
        /*.nb           =*/ { 0, 0, 0, 0 },
        /*.op           =*/ GGML_OP_NONE,
        /*.op_params    =*/ { 0 },
        /*.flags        =*/ 0,
        /*.src          =*/ { NULL },
        /*.view_src     =*/ view_src,
        /*.view_offs    =*/ view_offs,
        /*.data         =*/ obj_alloc_size > 0 ? (void *)(result + 1) : data,
        /*.name         =*/ { 0 },
        /*.extra        =*/ NULL,
        /*.padding      =*/ { 0 },
    };

    // TODO: this should not be needed as long as we don't rely on aligned SIMD loads
    //GGML_ASSERT_ALIGNED(result->data);

    for (int i = 0; i < n_dims; i++) {
        result->ne[i] = ne[i];
    }

    result->nb[0] = ggml_type_size(type);
    result->nb[1] = result->nb[0]*(result->ne[0]/ggml_blck_size(type));
    for (int i = 2; i < GGML_MAX_DIMS; i++) {
        result->nb[i] = result->nb[i - 1]*result->ne[i - 1];
    }

    ctx->n_objects++;

    return result;
}